

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

void ly_print_flush(lyout *out)

{
  if (out->type == LYOUT_STREAM) {
    fflush((FILE *)(out->method).f);
    return;
  }
  return;
}

Assistant:

void
ly_print_flush(struct lyout *out)
{
    switch (out->type) {
    case LYOUT_STREAM:
        fflush(out->method.f);
        break;
    case LYOUT_FD:
    case LYOUT_MEMORY:
    case LYOUT_CALLBACK:
        /* nothing to do */
        break;
    }
}